

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O3

void __thiscall DPolyobjInterpolation::Restore(DPolyobjInterpolation *this)

{
  double *pdVar1;
  FPolyObj *this_00;
  vertex_t **ppvVar2;
  double *pdVar3;
  double *pdVar4;
  double dVar5;
  ulong uVar6;
  ulong uVar7;
  
  this_00 = this->poly;
  uVar6 = (ulong)(this_00->Vertices).Count;
  if (uVar6 != 0) {
    ppvVar2 = (this_00->Vertices).Array;
    pdVar3 = (this->bakverts).Array;
    uVar7 = 0;
    do {
      pdVar4 = *(double **)((long)ppvVar2 + uVar7 * 4);
      pdVar1 = pdVar3 + (uVar7 & 0xffffffff);
      dVar5 = pdVar1[1];
      *pdVar4 = *pdVar1;
      pdVar4[1] = dVar5;
      uVar7 = uVar7 + 2;
    } while (uVar6 * 2 != uVar7);
  }
  dVar5 = this->bakcy;
  (this_00->CenterSpot).pos.X = this->bakcx;
  (this_00->CenterSpot).pos.Y = dVar5;
  FPolyObj::ClearSubsectorLinks(this_00);
  return;
}

Assistant:

void DPolyobjInterpolation::Restore()
{
	for(unsigned int i = 0; i < poly->Vertices.Size(); i++)
	{
		poly->Vertices[i]->set(bakverts[i*2  ], bakverts[i*2+1]);
	}
	poly->CenterSpot.pos.X = bakcx;
	poly->CenterSpot.pos.Y = bakcy;
	poly->ClearSubsectorLinks();
}